

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall CP::queue<int>::expand(queue<int> *this,size_t capacity)

{
  int *piVar1;
  ulong uVar2;
  size_t sVar3;
  int *__s;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  
  uVar4 = -(ulong)(capacity >> 0x3e != 0) | capacity * 4;
  __s = (int *)operator_new__(uVar4);
  memset(__s,0,uVar4);
  uVar4 = this->mSize;
  piVar1 = this->mData;
  uVar2 = this->mCap;
  sVar3 = this->mFront;
  for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
    __s[uVar5] = piVar1[(sVar3 + uVar5) % uVar2];
  }
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  this->mData = __s;
  this->mCap = capacity;
  this->mFront = 0;
  return;
}

Assistant:

void expand(size_t capacity) {
      T *arr = new T[capacity]();
      for (size_t i = 0;i < mSize;i++) {
        arr[i] = mData[(mFront + i) % mCap];
      }
      delete [] mData;
      mData = arr;
      mCap = capacity;
      mFront = 0;
    }